

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content_chunked<httplib::Response>
               (Stream *strm,Response *x,ContentReceiverWithProgress *out)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  FILE *__stream;
  size_t sVar5;
  FILE *pFVar6;
  size_t *__n;
  size_t *__n_00;
  size_t *__n_01;
  size_t *__n_02;
  size_t *__n_03;
  Stream *__lineptr;
  FILE **__endptr;
  char **ppcVar7;
  char *end;
  undefined1 local_e8 [4];
  int line_terminator_len;
  function<bool_(unsigned_long,_unsigned_long)> local_c8;
  FILE *local_a8;
  char *end_ptr;
  unsigned_long chunk_len;
  undefined1 local_88 [8];
  stream_line_reader line_reader;
  char buf [16];
  int bufsiz;
  ContentReceiverWithProgress *out_local;
  Response *x_local;
  Stream *strm_local;
  
  pFVar6 = (FILE *)0x10;
  __lineptr = strm;
  stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_88,strm,
             line_reader.glowable_buffer_.field_2._M_local_buf + 8,0x10);
  uVar3 = stream_line_reader::getline((stream_line_reader *)local_88,(char **)__lineptr,__n,pFVar6);
  if ((uVar3 & 1) == 0) {
    strm_local._7_1_ = false;
  }
  else {
    do {
      pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_88);
      __endptr = &local_a8;
      end_ptr = (char *)strtoul(pcVar4,(char **)__endptr,0x10);
      pFVar6 = local_a8;
      __stream = (FILE *)stream_line_reader::ptr((stream_line_reader *)local_88);
      ppcVar7 = (char **)end_ptr;
      if (pFVar6 == __stream) {
        strm_local._7_1_ = false;
        goto LAB_001a1041;
      }
      if (end_ptr == (char *)0xffffffffffffffff) {
        strm_local._7_1_ = false;
        goto LAB_001a1041;
      }
      if (end_ptr == (char *)0x0) {
        uVar3 = stream_line_reader::getline
                          ((stream_line_reader *)local_88,(char **)__endptr,__n_00,__stream);
        if ((uVar3 & 1) != 0) goto LAB_001a0f4a;
        strm_local._7_1_ = false;
        goto LAB_001a1041;
      }
      std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_c8,(nullptr_t)0x0);
      std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
                ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                 local_e8,out);
      pFVar6 = (FILE *)local_e8;
      bVar1 = read_content_with_length
                        (strm,(uint64_t)ppcVar7,&local_c8,(ContentReceiverWithProgress *)pFVar6);
      std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::~function
                ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                 local_e8);
      std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_c8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        strm_local._7_1_ = false;
        goto LAB_001a1041;
      }
      uVar3 = stream_line_reader::getline((stream_line_reader *)local_88,ppcVar7,__n_01,pFVar6);
      if ((uVar3 & 1) == 0) {
        strm_local._7_1_ = false;
        goto LAB_001a1041;
      }
      pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_88);
      ppcVar7 = (char **)0x206512;
      iVar2 = strcmp(pcVar4,"\r\n");
      if (iVar2 != 0) {
        strm_local._7_1_ = false;
        goto LAB_001a1041;
      }
      uVar3 = stream_line_reader::getline((stream_line_reader *)local_88,ppcVar7,__n_02,pFVar6);
    } while ((uVar3 & 1) != 0);
    strm_local._7_1_ = false;
  }
  goto LAB_001a1041;
  while( true ) {
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_88);
    pFVar6 = (FILE *)stream_line_reader::size((stream_line_reader *)local_88);
    ppcVar7 = (char **)(pcVar4 + -2 + (long)pFVar6);
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_88);
    parse_header<httplib::detail::read_content_chunked<httplib::Response>(httplib::Stream&,httplib::Response&,std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
              (pcVar4,(char *)ppcVar7,(anon_class_8_1_54a39818)x);
    uVar3 = stream_line_reader::getline((stream_line_reader *)local_88,ppcVar7,__n_03,pFVar6);
    if ((uVar3 & 1) == 0) break;
LAB_001a0f4a:
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_88);
    iVar2 = strcmp(pcVar4,"\r\n");
    if (iVar2 == 0) {
      strm_local._7_1_ = true;
      goto LAB_001a1041;
    }
    sVar5 = stream_line_reader::size((stream_line_reader *)local_88);
    if (0x2000 < sVar5) {
      strm_local._7_1_ = false;
      goto LAB_001a1041;
    }
  }
  strm_local._7_1_ = false;
LAB_001a1041:
  chunk_len._0_4_ = 1;
  stream_line_reader::~stream_line_reader((stream_line_reader *)local_88);
  return strm_local._7_1_;
}

Assistant:

inline bool read_content_chunked(Stream &strm, T &x,
                                 ContentReceiverWithProgress out) {
  const auto bufsiz = 16;
  char buf[bufsiz];

  stream_line_reader line_reader(strm, buf, bufsiz);

  if (!line_reader.getline()) { return false; }

  unsigned long chunk_len;
  while (true) {
    char *end_ptr;

    chunk_len = std::strtoul(line_reader.ptr(), &end_ptr, 16);

    if (end_ptr == line_reader.ptr()) { return false; }
    if (chunk_len == ULONG_MAX) { return false; }

    if (chunk_len == 0) { break; }

    if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
      return false;
    }

    if (!line_reader.getline()) { return false; }

    if (strcmp(line_reader.ptr(), "\r\n")) { return false; }

    if (!line_reader.getline()) { return false; }
  }

  assert(chunk_len == 0);

  // Trailer
  if (!line_reader.getline()) { return false; }

  while (strcmp(line_reader.ptr(), "\r\n")) {
    if (line_reader.size() > CPPHTTPLIB_HEADER_MAX_LENGTH) { return false; }

    // Exclude line terminator
    constexpr auto line_terminator_len = 2;
    auto end = line_reader.ptr() + line_reader.size() - line_terminator_len;

    parse_header(line_reader.ptr(), end,
                 [&](std::string &&key, std::string &&val) {
                   x.headers.emplace(std::move(key), std::move(val));
                 });

    if (!line_reader.getline()) { return false; }
  }

  return true;
}